

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O2

void cf2_doFlex(CF2_Stack opStack,CF2_F16Dot16 *curX,CF2_F16Dot16 *curY,CF2_GlyphPath glyphPath,
               FT_Bool *readFromStack,FT_Bool doConditionalLastRead)

{
  FT_Bool FVar1;
  int *piVar2;
  CF2_F16Dot16 CVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  FT_UFast idx;
  undefined7 in_register_00000089;
  undefined8 local_90;
  undefined8 local_88;
  CF2_F16Dot16 CStack_80;
  CF2_F16Dot16 local_7c [3];
  int aiStack_70 [8];
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  CF2_GlyphPath local_38;
  
  local_7c[0] = (CF2_F16Dot16)CONCAT71(in_register_00000089,doConditionalLastRead);
  local_38 = glyphPath;
  local_7c[1] = *curX;
  local_7c[2] = *curY;
  FVar1 = readFromStack[9];
  idx = 0;
  local_90 = opStack;
  local_88 = curY;
  for (lVar8 = 0; piVar2 = local_88, 10 - (ulong)(FVar1 == '\0') != lVar8; lVar8 = lVar8 + 1) {
    iVar7 = local_7c[lVar8 + 1];
    aiStack_70[lVar8] = iVar7;
    if (readFromStack[lVar8] != '\0') {
      CVar3 = cf2_stack_getReal(local_90,idx);
      aiStack_70[lVar8] = CVar3 + iVar7;
      idx = idx + 1;
    }
  }
  if (FVar1 == '\0') {
    local_4c = *local_88;
  }
  iVar7 = local_4c;
  if ((char)local_7c[0] == '\0') {
    if (readFromStack[10] == '\0') {
      iVar6 = *curX;
    }
    else {
      CVar3 = cf2_stack_getReal(local_90,idx);
      iVar6 = CVar3 + local_50;
      idx = idx + 1;
    }
    iVar7 = local_4c;
    local_48 = iVar6;
    if (readFromStack[0xb] == '\0') {
      iVar7 = *local_88;
    }
    else {
      CVar3 = cf2_stack_getReal(local_90,idx);
      iVar7 = CVar3 + iVar7;
    }
  }
  else {
    iVar4 = local_50 - *curX;
    iVar6 = -iVar4;
    if (0 < iVar4) {
      iVar6 = iVar4;
    }
    iVar5 = local_4c - *local_88;
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    CVar3 = cf2_stack_getReal(local_90,idx);
    if (iVar6 <= iVar4) {
      iVar6 = *curX;
      local_48 = iVar6;
      iVar7 = CVar3 + iVar7;
      local_44 = iVar7;
      goto LAB_001f8994;
    }
    iVar6 = CVar3 + local_50;
    local_48 = iVar6;
    iVar7 = *piVar2;
  }
  local_44 = iVar7;
LAB_001f8994:
  local_44 = iVar7;
  for (lVar8 = 0x1c; lVar8 != 0x4c; lVar8 = lVar8 + 0x18) {
    cf2_glyphpath_curveTo
              (local_38,*(CF2_F16Dot16 *)((long)&local_90 + lVar8 + 4),
               *(CF2_F16Dot16 *)((long)&local_88 + lVar8),
               *(CF2_F16Dot16 *)((long)&local_88 + lVar8 + 4),
               *(CF2_F16Dot16 *)((long)&CStack_80 + lVar8),*(CF2_F16Dot16 *)((long)local_7c + lVar8)
               ,*(CF2_F16Dot16 *)((long)local_7c + lVar8 + 4));
  }
  local_90->top = local_90->buffer;
  *curX = iVar6;
  *local_88 = iVar7;
  return;
}

Assistant:

static void
  cf2_doFlex( CF2_Stack       opStack,
              CF2_Fixed*      curX,
              CF2_Fixed*      curY,
              CF2_GlyphPath   glyphPath,
              const FT_Bool*  readFromStack,
              FT_Bool         doConditionalLastRead )
  {
    CF2_Fixed  vals[14];
    CF2_UInt   idx;
    FT_Bool    isHFlex;
    CF2_Int    top, i, j;


    vals[0] = *curX;
    vals[1] = *curY;
    idx     = 0;
    isHFlex = FT_BOOL( readFromStack[9] == FALSE );
    top     = isHFlex ? 9 : 10;

    for ( i = 0; i < top; i++ )
    {
      vals[i + 2] = vals[i];
      if ( readFromStack[i] )
        vals[i + 2] = ADD_INT32( vals[i + 2], cf2_stack_getReal( opStack,
                                                                 idx++ ) );
    }

    if ( isHFlex )
      vals[9 + 2] = *curY;

    if ( doConditionalLastRead )
    {
      FT_Bool    lastIsX = FT_BOOL(
                             cf2_fixedAbs( SUB_INT32( vals[10], *curX ) ) >
                             cf2_fixedAbs( SUB_INT32( vals[11], *curY ) ) );
      CF2_Fixed  lastVal = cf2_stack_getReal( opStack, idx );


      if ( lastIsX )
      {
        vals[12] = ADD_INT32( vals[10], lastVal );
        vals[13] = *curY;
      }
      else
      {
        vals[12] = *curX;
        vals[13] = ADD_INT32( vals[11], lastVal );
      }
    }
    else
    {
      if ( readFromStack[10] )
        vals[12] = ADD_INT32( vals[10],
                              cf2_stack_getReal( opStack, idx++ ) );
      else
        vals[12] = *curX;

      if ( readFromStack[11] )
        vals[13] = ADD_INT32( vals[11],
                              cf2_stack_getReal( opStack, idx ) );
      else
        vals[13] = *curY;
    }

    for ( j = 0; j < 2; j++ )
      cf2_glyphpath_curveTo( glyphPath, vals[j * 6 + 2],
                                        vals[j * 6 + 3],
                                        vals[j * 6 + 4],
                                        vals[j * 6 + 5],
                                        vals[j * 6 + 6],
                                        vals[j * 6 + 7] );

    cf2_stack_clear( opStack );

    *curX = vals[12];
    *curY = vals[13];
  }